

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockNodeRemoveWindow(ImGuiDockNode *node,ImGuiWindow *window,ImGuiID save_dock_id)

{
  ImGuiWindow **ppIVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow *pIVar3;
  ImGuiViewportP *pIVar4;
  ImGuiContext *ctx;
  int iVar5;
  ulong uVar6;
  size_t __n;
  ulong uVar7;
  
  ctx = GImGui;
  if (window->DockNode != node) {
    __assert_fail("window->DockNode == node",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3156,
                  "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)");
  }
  if ((save_dock_id != 0) && (node->ID != save_dock_id)) {
    __assert_fail("save_dock_id == 0 || save_dock_id == node->ID",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3159,
                  "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)");
  }
  window->DockNode = (ImGuiDockNode *)0x0;
  window->field_0x492 = window->field_0x492 & 0xfa;
  window->DockId = save_dock_id;
  UpdateWindowParentAndRootLinks(window,window->Flags & 0xfeffffff,(ImGuiWindow *)0x0);
  uVar6 = (ulong)(node->Windows).Size;
  if (0 < (long)uVar6) {
    ppIVar1 = (node->Windows).Data;
    __n = uVar6 * 8 - 8;
    uVar7 = 0;
    do {
      if (ppIVar1[uVar7] == window) {
        if (uVar6 <= uVar7) {
          __assert_fail("it >= Data && it < Data + Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                        ,0x5da,"T *ImVector<ImGuiWindow *>::erase(const T *) [T = ImGuiWindow *]");
        }
        memmove(ppIVar1 + uVar7,ppIVar1 + uVar7 + 1,__n);
        iVar5 = (node->Windows).Size + -1;
        (node->Windows).Size = iVar5;
        if (node->VisibleWindow == window) {
          node->VisibleWindow = (ImGuiWindow *)0x0;
        }
        node->field_0xba = node->field_0xba | 2;
        if (node->TabBar == (ImGuiTabBar *)0x0) {
LAB_0013d0dd:
          if (iVar5 == 0) {
            if (((node->LocalFlags & 0xc00) == 0) && (window->DockId != node->ID)) {
              DockContextRemoveNode(ctx,node,true);
              return;
            }
            goto LAB_0013d14b;
          }
        }
        else {
          TabBarRemoveTab(node->TabBar,window->ID);
          iVar5 = (node->Windows).Size;
          if (iVar5 < (int)(((node->LocalFlags & 0x800) == 0) + 1)) {
            if (node->TabBar != (ImGuiTabBar *)0x0) {
              IM_DELETE<ImGuiTabBar>(node->TabBar);
              node->TabBar = (ImGuiTabBar *)0x0;
              iVar5 = (node->Windows).Size;
            }
            goto LAB_0013d0dd;
          }
        }
        if (((iVar5 == 1) && ((node->LocalFlags & 0x800) == 0)) &&
           (pIVar2 = node->HostWindow, pIVar2 != (ImGuiWindow *)0x0)) {
          pIVar3 = *(node->Windows).Data;
          if ((pIVar2->ViewportOwned == true) && (node->ParentNode == (ImGuiDockNode *)0x0)) {
            pIVar4 = pIVar2->Viewport;
            if (pIVar4->Window != pIVar2) {
              __assert_fail("node->HostWindow->Viewport->Window == node->HostWindow",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                            ,0x3185,
                            "void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)"
                           );
            }
            pIVar4->Window = pIVar3;
            (pIVar4->super_ImGuiViewport).ID = pIVar3->ID;
          }
          pIVar3->Collapsed = pIVar2->Collapsed;
        }
LAB_0013d14b:
        DockNodeUpdateVisibleFlag(node);
        return;
      }
      uVar7 = uVar7 + 1;
      __n = __n - 8;
    } while (__n != 0xfffffffffffffff8);
  }
  __assert_fail("erased",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0x316a,"void ImGui::DockNodeRemoveWindow(ImGuiDockNode *, ImGuiWindow *, ImGuiID)")
  ;
}

Assistant:

static void ImGui::DockNodeRemoveWindow(ImGuiDockNode* node, ImGuiWindow* window, ImGuiID save_dock_id)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window->DockNode == node);
    //IM_ASSERT(window->RootWindow == node->HostWindow);
    //IM_ASSERT(window->LastFrameActive < g.FrameCount);    // We may call this from Begin()
    IM_ASSERT(save_dock_id == 0 || save_dock_id == node->ID);
    IMGUI_DEBUG_LOG_DOCKING("DockNodeRemoveWindow node 0x%08X window '%s'\n", node->ID, window->Name);

    window->DockNode = NULL;
    window->DockIsActive = window->DockTabWantClose = false;
    window->DockId = save_dock_id;
    UpdateWindowParentAndRootLinks(window, window->Flags & ~ImGuiWindowFlags_ChildWindow, NULL); // Update immediately

    // Remove window
    bool erased = false;
    for (int n = 0; n < node->Windows.Size; n++)
        if (node->Windows[n] == window)
        {
            node->Windows.erase(node->Windows.Data + n);
            erased = true;
            break;
        }
    IM_ASSERT(erased);
    if (node->VisibleWindow == window)
        node->VisibleWindow = NULL;

    // Remove tab and possibly tab bar
    node->WantHiddenTabBarUpdate = true;
    if (node->TabBar)
    {
        TabBarRemoveTab(node->TabBar, window->ID);
        const int tab_count_threshold_for_tab_bar = node->IsCentralNode() ? 1 : 2;
        if (node->Windows.Size < tab_count_threshold_for_tab_bar)
            DockNodeRemoveTabBar(node);
    }

    if (node->Windows.Size == 0 && !node->IsCentralNode() && !node->IsDockSpace() && window->DockId != node->ID)
    {
        // Automatic dock node delete themselves if they are not holding at least one tab
        DockContextRemoveNode(&g, node, true);
        return;
    }

    if (node->Windows.Size == 1 && !node->IsCentralNode() && node->HostWindow)
    {
        ImGuiWindow* remaining_window = node->Windows[0];
        if (node->HostWindow->ViewportOwned && node->IsRootNode())
        {
            // Transfer viewport back to the remaining loose window
            IM_ASSERT(node->HostWindow->Viewport->Window == node->HostWindow);
            node->HostWindow->Viewport->Window = remaining_window;
            node->HostWindow->Viewport->ID = remaining_window->ID;
        }
        remaining_window->Collapsed = node->HostWindow->Collapsed;
    }

    // Update visibility immediately is required so the DockNodeUpdateRemoveInactiveChilds() processing can reflect changes up the tree
    DockNodeUpdateVisibleFlag(node);
}